

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void SetupDrawData(ImVector<ImDrawList_*> *draw_lists,ImDrawData *out_draw_data)

{
  ImDrawList **local_28;
  int local_1c;
  int n;
  ImDrawData *out_draw_data_local;
  ImVector<ImDrawList_*> *draw_lists_local;
  
  out_draw_data->Valid = true;
  if (draw_lists->Size < 1) {
    local_28 = (ImDrawList **)0x0;
  }
  else {
    local_28 = draw_lists->Data;
  }
  out_draw_data->CmdLists = local_28;
  out_draw_data->CmdListsCount = draw_lists->Size;
  out_draw_data->TotalIdxCount = 0;
  out_draw_data->TotalVtxCount = 0;
  for (local_1c = 0; local_1c < draw_lists->Size; local_1c = local_1c + 1) {
    out_draw_data->TotalVtxCount =
         (draw_lists->Data[local_1c]->VtxBuffer).Size + out_draw_data->TotalVtxCount;
    out_draw_data->TotalIdxCount =
         (draw_lists->Data[local_1c]->IdxBuffer).Size + out_draw_data->TotalIdxCount;
  }
  return;
}

Assistant:

static void SetupDrawData(ImVector<ImDrawList*>* draw_lists, ImDrawData* out_draw_data)
{
    out_draw_data->Valid = true;
    out_draw_data->CmdLists = (draw_lists->Size > 0) ? draw_lists->Data : NULL;
    out_draw_data->CmdListsCount = draw_lists->Size;
    out_draw_data->TotalVtxCount = out_draw_data->TotalIdxCount = 0;
    for (int n = 0; n < draw_lists->Size; n++)
    {
        out_draw_data->TotalVtxCount += draw_lists->Data[n]->VtxBuffer.Size;
        out_draw_data->TotalIdxCount += draw_lists->Data[n]->IdxBuffer.Size;
    }
}